

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall embree::Stream<int>::drop(Stream<int> *this)

{
  pointer ppVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *this_00;
  uint uVar4;
  ParseLocation l;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  ssize_t local_58;
  ssize_t sStack_50;
  int local_48;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  ssize_t local_30;
  ssize_t sStack_28;
  
  sVar3 = this->future;
  if (sVar3 == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&local_68,this);
    local_48 = (*(this->super_RefCount)._vptr_RefCount[4])(this);
    local_40 = local_68;
    local_38._M_pi = local_60;
    if (local_60 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_30 = local_58;
      sStack_28 = sStack_50;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
      local_30 = local_58;
      sStack_28 = sStack_50;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
    }
    sVar3 = this->past;
    sVar2 = this->future;
    if (sVar2 + sVar3 == 0x400) {
      if (sVar3 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = (int)this->start + 1U & 0x3ff;
      this->start = (ulong)uVar4;
      sVar3 = sVar3 - 1;
      this->past = sVar3;
    }
    else {
      uVar4 = (uint)this->start;
    }
    this->future = sVar2 + 1;
    ppVar1 = (this->buffer).
             super__Vector_base<std::pair<int,_embree::ParseLocation>,_std::allocator<std::pair<int,_embree::ParseLocation>_>_>
             ._M_impl.super__Vector_impl_data._M_start + ((int)sVar3 + uVar4 + (int)sVar2 & 0x3ff);
    ppVar1->first = local_48;
    (ppVar1->second).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_40;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(ppVar1->second).fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_38);
    (ppVar1->second).lineNumber = local_30;
    (ppVar1->second).colNumber = sStack_28;
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    sVar3 = this->future;
  }
  this->past = this->past + 1;
  this->future = sVar3 - 1;
  return;
}

Assistant:

void drop() {
      if (future == 0) push_back(nextHelper());
      past++; future--;
    }